

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall
FastVector<ExternMemberInfo,_false,_false>::grow_and_add
          (FastVector<ExternMemberInfo,_false,_false> *this,uint newSize,ExternMemberInfo *valPtr,
          uint elem)

{
  uint uVar1;
  ExternMemberInfo *pEVar2;
  ExternMemberInfo *pEVar3;
  undefined8 uVar4;
  long lVar5;
  
  pEVar2 = this->data;
  grow_no_destroy(this,newSize);
  if (elem != 0) {
    lVar5 = 0;
    do {
      pEVar3 = this->data;
      uVar1 = this->count;
      this->count = uVar1 + 1;
      pEVar3[uVar1].offset = *(uint *)((long)&valPtr->offset + lVar5);
      uVar4 = *(undefined8 *)((long)&valPtr->type + lVar5);
      pEVar3 = pEVar3 + uVar1;
      pEVar3->type = (int)uVar4;
      pEVar3->alignment = (int)((ulong)uVar4 >> 0x20);
      lVar5 = lVar5 + 0xc;
    } while ((ulong)elem * 0xc != lVar5);
  }
  if (pEVar2 != (ExternMemberInfo *)0x0) {
    (*(code *)NULLC::dealloc)(pEVar2);
    return;
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T* valPtr, unsigned elem)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		for(unsigned i = 0; i < elem; i++)
			data[count++] = valPtr[i];

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}